

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  ushort **ppuVar2;
  uint local_44;
  byte *pbStack_40;
  uint cutoff;
  char *e;
  char *escaped;
  byte *pbStack_28;
  uchar c;
  char *s;
  curl_off_t len_local;
  char *str_local;
  
  local_44 = 0;
  s = (char *)len;
  if (len == -1) {
    s = (char *)strlen(str);
  }
  if (2000 < (long)s) {
    s = (char *)0x7d0;
    local_44 = 3;
  }
  str_local = (char *)malloc((long)s * 4 + 1 + (ulong)local_44);
  pbStack_40 = (byte *)str_local;
  pbStack_28 = (byte *)str;
  if ((byte *)str_local == (byte *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    for (; s != (char *)0x0; s = s + -1) {
      bVar1 = *pbStack_28;
      if (bVar1 == 10) {
        strcpy((char *)pbStack_40,"\\n");
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 0xd) {
        strcpy((char *)pbStack_40,"\\r");
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 9) {
        strcpy((char *)pbStack_40,"\\t");
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 0x5c) {
        strcpy((char *)pbStack_40,"\\\\");
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 0x22) {
        strcpy((char *)pbStack_40,"\\\"");
        pbStack_40 = pbStack_40 + 2;
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(uint)bVar1] & 0x4000) == 0) {
          curl_msnprintf(pbStack_40,5,"\\x%02x",bVar1);
          pbStack_40 = pbStack_40 + 4;
        }
        else {
          *pbStack_40 = bVar1;
          pbStack_40 = pbStack_40 + 1;
        }
      }
      pbStack_28 = pbStack_28 + 1;
    }
    while (local_44 != 0) {
      *pbStack_40 = 0x2e;
      local_44 = local_44 - 1;
      pbStack_40 = pbStack_40 + 1;
    }
    *pbStack_40 = 0;
  }
  return str_local;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;
  unsigned int cutoff = 0;

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  /* Allocate space based on worst-case */
  escaped = malloc(4 * (size_t)len + 1 + cutoff);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; len; s++, len--) {
    c = *s;
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(!isprint(c)) {
      msnprintf(e, 5, "\\x%02x", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  while(cutoff--)
    *e++ = '.';
  *e = '\0';
  return escaped;
}